

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O1

void __thiscall vmdict_TrieNode::~vmdict_TrieNode(vmdict_TrieNode *this)

{
  vmdict_TrieNode *this_00;
  vmdict_TrieNode *n;
  
  this_00 = this->chi;
  while (this_00 != (vmdict_TrieNode *)0x0) {
    this->chi = this_00->nxt;
    ~vmdict_TrieNode(this_00);
    operator_delete(this_00,0x18);
    this_00 = this->chi;
  }
  return;
}

Assistant:

~vmdict_TrieNode()
    {
        /* delete the subtree */
        while (chi != 0)
        {
            /* unlink this child */
            vmdict_TrieNode *n = chi;
            chi = chi->nxt;

            /* delete it */
            delete n;
        }
    }